

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Button::on_mouse_button_down(Button *this,int mx,int my)

{
  ulong uVar1;
  long *in_RDI;
  
  uVar1 = (**(code **)(*in_RDI + 0x80))();
  if ((uVar1 & 1) == 0) {
    *(undefined1 *)(in_RDI + 0xb) = 1;
    Dialog::request_draw((Dialog *)in_RDI[3]);
  }
  return;
}

Assistant:

void Button::on_mouse_button_down(int mx, int my)
{
   (void)mx;
   (void)my;

   if (is_disabled())
      return;

   this->pushed = true;
   dialog->request_draw();
}